

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::InitializeUpdateValidity
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  unsigned_long *puVar5;
  SelectionVector *pSVar6;
  sel_t *psVar7;
  sel_t *psVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar2 = update_info->N;
  lVar1 = (ulong)update_info->max * 4;
  puVar5 = (update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar5 == (unsigned_long *)0x0) {
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined1 *)((long)&update_info[1].segment + uVar9 + lVar1) = 1;
    }
  }
  else {
    pSVar6 = update->sel;
    psVar7 = sel->sel_vector;
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      uVar10 = uVar9;
      if (psVar7 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar7[uVar9];
      }
      psVar8 = pSVar6->sel_vector;
      if (psVar8 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar8[uVar10];
      }
      *(bool *)((long)&update_info[1].segment + uVar9 + lVar1) =
           (puVar5[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0;
    }
  }
  FlatVector::VerifyFlatVector(base_data);
  uVar2 = base_info->N;
  uVar3 = base_info->max;
  puVar5 = (base_data->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  if (puVar5 == (unsigned_long *)0x0) {
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined1 *)((long)&base_info[1].segment + uVar9 + (ulong)uVar3 * 4) = 1;
    }
  }
  else {
    for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
      uVar4 = *(uint *)((long)&base_info[1].segment + uVar9 * 4);
      *(bool *)((long)&base_info[1].segment + uVar9 + (ulong)uVar3 * 4) =
           (puVar5[uVar4 >> 6] >> ((ulong)uVar4 & 0x3f) & 1) != 0;
    }
  }
  return;
}

Assistant:

static void InitializeUpdateValidity(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                     UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto &update_mask = update.validity;
	auto tuple_data = update_info.GetData<bool>();

	if (!update_mask.AllValid()) {
		for (idx_t i = 0; i < update_info.N; i++) {
			auto idx = update.sel->get_index(sel.get_index(i));
			tuple_data[i] = update_mask.RowIsValidUnsafe(idx);
		}
	} else {
		for (idx_t i = 0; i < update_info.N; i++) {
			tuple_data[i] = true;
		}
	}

	auto &base_mask = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<bool>();
	auto base_tuples = base_info.GetTuples();
	if (!base_mask.AllValid()) {
		for (idx_t i = 0; i < base_info.N; i++) {
			base_tuple_data[i] = base_mask.RowIsValidUnsafe(base_tuples[i]);
		}
	} else {
		for (idx_t i = 0; i < base_info.N; i++) {
			base_tuple_data[i] = true;
		}
	}
}